

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O0

void rfc5444_writer_cleanup(rfc5444_writer *writer)

{
  list_entity *plVar1;
  list_entity *__tempptr_27;
  list_entity *__tempptr_26;
  list_entity *__tempptr_25;
  list_entity *__tempptr_24;
  list_entity *__tempptr_23;
  list_entity *__tempptr_22;
  list_entity *__tempptr_21;
  list_entity *__tempptr_20;
  list_entity *__tempptr_19;
  list_entity *__tempptr_18;
  list_entity *__tempptr_17;
  list_entity *__tempptr_16;
  list_entity *__tempptr_15;
  list_entity *__tempptr_14;
  list_entity *__tempptr_13;
  list_entity *__tempptr_12;
  list_entity *__tempptr_11;
  list_entity *__tempptr_10;
  list_entity *__tempptr_9;
  list_entity *__tempptr_8;
  list_entity *__tempptr_7;
  list_entity *__tempptr_6;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  rfc5444_writer_postprocessor *safe_proc;
  rfc5444_writer_postprocessor *processor;
  rfc5444_writer_target *safe_interf;
  rfc5444_writer_target *interf;
  rfc5444_writer_tlvtype *safe_tt;
  rfc5444_writer_tlvtype *tlvtype;
  rfc5444_writer_content_provider *safe_prv;
  rfc5444_writer_content_provider *provider;
  rfc5444_writer_pkthandler *safe_pkt;
  rfc5444_writer_pkthandler *pkt;
  rfc5444_writer_message *safe_msg;
  rfc5444_writer_message *msg;
  rfc5444_writer *writer_local;
  
  if (writer == (rfc5444_writer *)0x0) {
    __assert_fail("writer",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                  ,0x83,"void rfc5444_writer_cleanup(struct rfc5444_writer *)");
  }
  if (writer->_state == RFC5444_WRITER_NONE) {
    safe_pkt = (rfc5444_writer_pkthandler *)(writer->_pkthandlers).next;
    provider = (rfc5444_writer_content_provider *)(safe_pkt->_pkthandle_node).next;
    while( true ) {
      if ((safe_pkt->_pkthandle_node).prev == (writer->_pkthandlers).prev) break;
      rfc5444_writer_unregister_pkthandler(writer,safe_pkt);
      safe_pkt = (rfc5444_writer_pkthandler *)provider;
      provider = *(rfc5444_writer_content_provider **)provider;
    }
    plVar1 = (writer->_targets).next;
    safe_interf = (rfc5444_writer_target *)(plVar1 + -3);
    plVar1 = plVar1->next;
    while( true ) {
      processor = (rfc5444_writer_postprocessor *)(plVar1 + -3);
      if ((safe_interf->_target_node).prev == (writer->_targets).prev) break;
      rfc5444_writer_unregister_target(writer,safe_interf);
      safe_interf = (rfc5444_writer_target *)processor;
      plVar1 = plVar1->next;
    }
    plVar1 = (writer->_addr_tlvtype_head).next;
    safe_tt = (rfc5444_writer_tlvtype *)&plVar1[-1].prev;
    plVar1 = plVar1->next;
    while( true ) {
      interf = (rfc5444_writer_target *)&plVar1[-1].prev;
      if ((safe_tt->_tlvtype_node).prev == (writer->_addr_tlvtype_head).prev) break;
      rfc5444_writer_unregister_addrtlvtype(writer,safe_tt);
      safe_tt = (rfc5444_writer_tlvtype *)interf;
      plVar1 = plVar1->next;
    }
    safe_proc = (rfc5444_writer_postprocessor *)(writer->_processors).list_head.next;
    __tempptr = (safe_proc->_node).list.next;
    while( true ) {
      if ((safe_proc->_node).list.prev == (writer->_processors).list_head.prev) break;
      rfc5444_writer_unregister_postprocessor(writer,safe_proc);
      safe_proc = (rfc5444_writer_postprocessor *)__tempptr;
      __tempptr = __tempptr->next;
    }
    safe_msg = (rfc5444_writer_message *)(writer->_msgcreators).list_head.next;
    pkt = (rfc5444_writer_pkthandler *)(safe_msg->_msgcreator_node).list.next;
    while( true ) {
      if ((safe_msg->_msgcreator_node).list.prev == (writer->_msgcreators).list_head.prev) break;
      safe_msg->_registered = true;
      plVar1 = (safe_msg->_provider_tree).list_head.next;
      safe_prv = (rfc5444_writer_content_provider *)(plVar1 + -2);
      plVar1 = plVar1->next;
      while( true ) {
        tlvtype = (rfc5444_writer_tlvtype *)(plVar1 + -2);
        if ((safe_prv->_provider_node).list.prev == (safe_msg->_provider_tree).list_head.prev)
        break;
        rfc5444_writer_unregister_content_provider(writer,safe_prv,(rfc5444_writer_tlvtype *)0x0,0);
        safe_prv = (rfc5444_writer_content_provider *)tlvtype;
        plVar1 = plVar1->next;
      }
      plVar1 = (safe_msg->_msgspecific_tlvtype_head).next;
      safe_tt = (rfc5444_writer_tlvtype *)&plVar1[-1].prev;
      plVar1 = plVar1->next;
      while( true ) {
        interf = (rfc5444_writer_target *)&plVar1[-1].prev;
        if ((safe_tt->_tlvtype_node).prev == (safe_msg->_msgspecific_tlvtype_head).prev) break;
        rfc5444_writer_unregister_addrtlvtype(writer,safe_tt);
        safe_tt = (rfc5444_writer_tlvtype *)interf;
        plVar1 = plVar1->next;
      }
      rfc5444_writer_unregister_message(writer,safe_msg);
      safe_msg = (rfc5444_writer_message *)pkt;
      pkt = (rfc5444_writer_pkthandler *)(pkt->_pkthandle_node).next;
    }
    return;
  }
  __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                ,0x85,"void rfc5444_writer_cleanup(struct rfc5444_writer *)");
}

Assistant:

void
rfc5444_writer_cleanup(struct rfc5444_writer *writer) {
  struct rfc5444_writer_message *msg, *safe_msg;
  struct rfc5444_writer_pkthandler *pkt, *safe_pkt;
  struct rfc5444_writer_content_provider *provider, *safe_prv;
  struct rfc5444_writer_tlvtype *tlvtype, *safe_tt;
  struct rfc5444_writer_target *interf, *safe_interf;
  struct rfc5444_writer_postprocessor *processor, *safe_proc;

  assert(writer);
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  /* remove all packet handlers */
  list_for_each_element_safe(&writer->_pkthandlers, pkt, _pkthandle_node, safe_pkt) {
    rfc5444_writer_unregister_pkthandler(writer, pkt);
  }

  /* remove all _targets */
  list_for_each_element_safe(&writer->_targets, interf, _target_node, safe_interf) {
    rfc5444_writer_unregister_target(writer, interf);
  }

  /* remove all generic address tlvtypes */
  list_for_each_element_safe(&writer->_addr_tlvtype_head, tlvtype, _tlvtype_node, safe_tt) {
    rfc5444_writer_unregister_addrtlvtype(writer, tlvtype);
  }

  /* remove all packet postprocessors */
  avl_for_each_element_safe(&writer->_processors, processor, _node, safe_proc) {
    rfc5444_writer_unregister_postprocessor(writer, processor);
  }

  /* remove all message creators */
  avl_for_each_element_safe(&writer->_msgcreators, msg, _msgcreator_node, safe_msg) {
    /* prevent message from being freed in the middle of the processing */
    msg->_registered = true;

    /* remove all message content providers */
    avl_for_each_element_safe(&msg->_provider_tree, provider, _provider_node, safe_prv) {
      rfc5444_writer_unregister_content_provider(writer, provider, NULL, 0);
    }

    /* remove all registered address tlvs */
    list_for_each_element_safe(&msg->_msgspecific_tlvtype_head, tlvtype, _tlvtype_node, safe_tt) {
      rfc5444_writer_unregister_addrtlvtype(writer, tlvtype);
    }

    /* remove message and addresses */
    rfc5444_writer_unregister_message(writer, msg);
  }
}